

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O2

void Unit_Test::generateRoi
               (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                *image,vector<unsigned_int,_std::allocator<unsigned_int>_> *x,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *y,uint32_t *width,
               uint32_t *height)

{
  pointer pIVar1;
  pointer pIVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  pair<unsigned_int,_unsigned_int> *ppVar4;
  ulong uVar5;
  allocator_type local_51;
  uint32_t *local_50;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  imageSize;
  
  local_50 = height;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&imageSize,
           ((long)(image->
                  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(image->
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x28,&local_51);
  pIVar1 = (image->
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (image->
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = (pair<unsigned_int,_unsigned_int> *)&pIVar1->_width;
  for (uVar5 = 0; uVar5 < (ulong)(((long)pIVar2 - (long)pIVar1) / 0x28); uVar5 = uVar5 + 1) {
    pVar3 = *ppVar4;
    ppVar4 = ppVar4 + 5;
    imageSize.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar5] = pVar3;
  }
  generateRoi(&imageSize,x,y,width,local_50);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&imageSize.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  return;
}

Assistant:

void generateRoi( const std::vector < PenguinV_Image::Image > & image, std::vector < uint32_t > & x, std::vector < uint32_t > & y,
                      uint32_t & width, uint32_t & height )
    {
        std::vector < std::pair < uint32_t, uint32_t> > imageSize( image.size() );

        for( size_t i = 0; i < image.size(); ++i )
            imageSize[i] = std::pair < uint32_t, uint32_t >( image[i].width(), image[i].height() ) ;

        generateRoi( imageSize, x, y, width, height );
    }